

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMPTEAnalyzerResults.cpp
# Opt level: O3

void __thiscall
SMPTEAnalyzerResults::fillSMPTE(SMPTEAnalyzerResults *this,Frame *frame,char *resultstr)

{
  Frame FVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [14];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  unkuint9 Var10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [15];
  undefined1 auVar13 [13];
  undefined1 auVar14 [14];
  undefined1 auVar15 [15];
  uint6 uVar16;
  uint uVar17;
  size_t sVar18;
  char *pcVar19;
  long lVar20;
  char cVar21;
  undefined4 uVar24;
  undefined1 auVar22 [15];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  char str2 [128];
  char str [128];
  char buff [128];
  char local_1b8 [4];
  undefined2 uStack_1b4;
  undefined8 uStack_1b2;
  char local_138 [264];
  
  local_138[0] = '\0';
  local_138[1] = '\0';
  local_138[2] = '\0';
  local_138[3] = '\0';
  local_138[4] = '\0';
  local_138[5] = '\0';
  local_138[6] = '\0';
  local_138[7] = '\0';
  local_138[8] = '\0';
  local_138[9] = '\0';
  local_138[10] = '\0';
  local_138[0xb] = '\0';
  local_138[0xc] = '\0';
  local_138[0xd] = '\0';
  local_138[0xe] = '\0';
  local_138[0xf] = '\0';
  local_138[0x10] = '\0';
  local_138[0x11] = '\0';
  local_138[0x12] = '\0';
  local_138[0x13] = '\0';
  local_138[0x14] = '\0';
  local_138[0x15] = '\0';
  local_138[0x16] = '\0';
  local_138[0x17] = '\0';
  local_138[0x18] = '\0';
  local_138[0x19] = '\0';
  local_138[0x1a] = '\0';
  local_138[0x1b] = '\0';
  local_138[0x1c] = '\0';
  local_138[0x1d] = '\0';
  local_138[0x1e] = '\0';
  local_138[0x1f] = '\0';
  local_138[0x20] = '\0';
  local_138[0x21] = '\0';
  local_138[0x22] = '\0';
  local_138[0x23] = '\0';
  local_138[0x24] = '\0';
  local_138[0x25] = '\0';
  local_138[0x26] = '\0';
  local_138[0x27] = '\0';
  local_138[0x28] = '\0';
  local_138[0x29] = '\0';
  local_138[0x2a] = '\0';
  local_138[0x2b] = '\0';
  local_138[0x2c] = '\0';
  local_138[0x2d] = '\0';
  local_138[0x2e] = '\0';
  local_138[0x2f] = '\0';
  local_138[0x30] = '\0';
  local_138[0x31] = '\0';
  local_138[0x32] = '\0';
  local_138[0x33] = '\0';
  local_138[0x34] = '\0';
  local_138[0x35] = '\0';
  local_138[0x36] = '\0';
  local_138[0x37] = '\0';
  local_138[0x38] = '\0';
  local_138[0x39] = '\0';
  local_138[0x3a] = '\0';
  local_138[0x3b] = '\0';
  local_138[0x3c] = '\0';
  local_138[0x3d] = '\0';
  local_138[0x3e] = '\0';
  local_138[0x3f] = '\0';
  local_138[0x40] = '\0';
  local_138[0x41] = '\0';
  local_138[0x42] = '\0';
  local_138[0x43] = '\0';
  local_138[0x44] = '\0';
  local_138[0x45] = '\0';
  local_138[0x46] = '\0';
  local_138[0x47] = '\0';
  local_138[0x48] = '\0';
  local_138[0x49] = '\0';
  local_138[0x4a] = '\0';
  local_138[0x4b] = '\0';
  local_138[0x4c] = '\0';
  local_138[0x4d] = '\0';
  local_138[0x4e] = '\0';
  local_138[0x4f] = '\0';
  local_138[0x50] = '\0';
  local_138[0x51] = '\0';
  local_138[0x52] = '\0';
  local_138[0x53] = '\0';
  local_138[0x54] = '\0';
  local_138[0x55] = '\0';
  local_138[0x56] = '\0';
  local_138[0x57] = '\0';
  local_138[0x58] = '\0';
  local_138[0x59] = '\0';
  local_138[0x5a] = '\0';
  local_138[0x5b] = '\0';
  local_138[0x5c] = '\0';
  local_138[0x5d] = '\0';
  local_138[0x5e] = '\0';
  local_138[0x5f] = '\0';
  local_138[0x60] = '\0';
  local_138[0x61] = '\0';
  local_138[0x62] = '\0';
  local_138[99] = '\0';
  local_138[100] = '\0';
  local_138[0x65] = '\0';
  local_138[0x66] = '\0';
  local_138[0x67] = '\0';
  local_138[0x68] = '\0';
  local_138[0x69] = '\0';
  local_138[0x6a] = '\0';
  local_138[0x6b] = '\0';
  local_138[0x6c] = '\0';
  local_138[0x6d] = '\0';
  local_138[0x6e] = '\0';
  local_138[0x6f] = '\0';
  local_138[0x70] = '\0';
  local_138[0x71] = '\0';
  local_138[0x72] = '\0';
  local_138[0x73] = '\0';
  local_138[0x74] = '\0';
  local_138[0x75] = '\0';
  local_138[0x76] = '\0';
  local_138[0x77] = '\0';
  local_138[0x78] = '\0';
  local_138[0x79] = '\0';
  local_138[0x7a] = '\0';
  local_138[0x7b] = '\0';
  local_138[0x7c] = '\0';
  local_138[0x7d] = '\0';
  local_138[0x7e] = '\0';
  local_138[0x7f] = '\0';
  lVar20 = 0;
  do {
    cVar21 = ((&DAT_0010610c)[lVar20 * 4] & (byte)frame[lVar20 + 0x17]) + 0x30;
    if ((int)(&DAT_001060ec)[lVar20] <
        (int)(uint)((&DAT_0010610c)[lVar20 * 4] & (byte)frame[lVar20 + 0x17])) {
      cVar21 = '?';
    }
    sVar18 = strlen(local_138);
    local_138[sVar18] = cVar21;
    if ((lVar20 != -7) && (((int)lVar20 - 1U & 1) == 0)) {
      cVar21 = ':';
      if (lVar20 == -5) {
        cVar21 = '.';
      }
      sVar18 = strlen(local_138);
      local_138[sVar18] = cVar21;
    }
    lVar20 = lVar20 + -1;
  } while (lVar20 != -8);
  if (resultstr == (char *)0x0) {
    AnalyzerResults::AddResultString
              ((char *)this,"T",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"TS",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,local_138 + 8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,local_138 + 6,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,local_138 + 3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,local_138,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  strcpy(local_1b8,local_138);
  FVar1 = frame[0x11];
  if (((byte)FVar1 & 4) == 0) {
    sVar18 = strlen(local_1b8);
    builtin_strncpy(local_1b8 + sVar18," no-drop",8);
    *(undefined1 *)((long)&uStack_1b2 + sVar18 + 2) = 0;
  }
  else {
    sVar18 = strlen(local_138);
    (local_138 + sVar18)[0] = 'd';
    (local_138 + sVar18)[1] = '\0';
    sVar18 = strlen(local_1b8);
    builtin_strncpy(local_1b8 + sVar18," dro",4);
    *(undefined2 *)((long)&uStack_1b4 + sVar18) = 0x70;
  }
  if (((byte)FVar1 & 8) == 0) {
    sVar18 = strlen(local_1b8);
    builtin_strncpy(local_1b8 + sVar18," no-colo",8);
    *(undefined4 *)((long)&uStack_1b2 + sVar18 + 1) = 0x72756f;
  }
  else {
    sVar18 = strlen(local_138);
    (local_138 + sVar18)[0] = 'c';
    (local_138 + sVar18)[1] = '\0';
    sVar18 = strlen(local_1b8);
    builtin_strncpy(local_1b8 + sVar18," colour",8);
  }
  auVar22 = ZEXT415(*(uint *)(frame + 0x10) ^ *(uint *)(frame + 0x14)) ^ DAT_001060c0._0_15_;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar22._0_13_;
  auVar2[0xe] = auVar22[7];
  auVar4[0xc] = auVar22[6];
  auVar4._0_12_ = auVar22._0_12_;
  auVar4._13_2_ = auVar2._13_2_;
  auVar5[0xb] = 0;
  auVar5._0_11_ = auVar22._0_11_;
  auVar5._12_3_ = auVar4._12_3_;
  auVar6[10] = auVar22[5];
  auVar6._0_10_ = auVar22._0_10_;
  auVar6._11_4_ = auVar5._11_4_;
  auVar7[9] = 0;
  auVar7._0_9_ = auVar22._0_9_;
  auVar7._10_5_ = auVar6._10_5_;
  auVar8[8] = auVar22[4];
  auVar8._0_8_ = auVar22._0_8_;
  auVar8._9_6_ = auVar7._9_6_;
  auVar9._7_8_ = 0;
  auVar9._0_7_ = auVar8._8_7_;
  Var10 = CONCAT81(SUB158(auVar9 << 0x40,7),auVar22[3]);
  auVar15._9_6_ = 0;
  auVar15._0_9_ = Var10;
  auVar11._1_10_ = SUB1510(auVar15 << 0x30,5);
  auVar11[0] = auVar22[2];
  auVar12._11_4_ = 0;
  auVar12._0_11_ = auVar11;
  auVar13._1_12_ = SUB1512(auVar12 << 0x20,3);
  auVar13[0] = auVar22[1];
  auVar23._0_2_ = CONCAT11(0,auVar22[0]);
  auVar22._2_13_ = auVar13;
  auVar22._0_2_ = auVar23._0_2_;
  auVar3._10_2_ = 0;
  auVar3._0_10_ = auVar22._0_10_;
  auVar3._12_2_ = (short)Var10;
  uVar16 = CONCAT42(auVar3._10_4_,auVar11._0_2_);
  auVar14._6_8_ = 0;
  auVar14._0_6_ = uVar16;
  auVar23._6_8_ = SUB148(auVar14 << 0x40,6);
  auVar23._4_2_ = auVar13._0_2_;
  auVar23._2_2_ = 0;
  auVar23._14_2_ = 0;
  uVar24 = (undefined4)uVar16;
  uVar17 = auVar3._10_4_ >> 0x10;
  auVar25._4_4_ = uVar17;
  auVar25._0_4_ = uVar24;
  auVar25._8_4_ = uVar24;
  auVar25._12_4_ = uVar17;
  uVar17 = SUB164(auVar25 ^ auVar23,4) ^ SUB164(auVar25 ^ auVar23,0);
  uVar17 = uVar17 >> 4 ^ uVar17;
  uVar17 = uVar17 >> 2 ^ uVar17;
  sVar18 = strlen(local_138);
  pcVar19 = local_138 + sVar18;
  if (((uVar17 >> 1 ^ uVar17) & 1) == 0) {
    pcVar19[0] = 'p';
    pcVar19[1] = '\0';
    sVar18 = strlen(local_1b8);
    builtin_strncpy(local_1b8 + sVar18," parity-",8);
    *(undefined4 *)((long)&uStack_1b2 + sVar18 + 1) = 0x6b6f2d;
  }
  else {
    local_138[sVar18 + 2] = '\0';
    pcVar19[0] = ' ';
    pcVar19[1] = 'P';
    sVar18 = strlen(local_1b8);
    builtin_strncpy(local_1b8 + sVar18," Parity-",8);
    *(undefined8 *)((long)&uStack_1b2 + sVar18) = 0x214c4941462d79;
  }
  snprintf(local_138 + 0x80,0x80," User=%X-%X-%X-%X-%X-%X-%X-%X, groupBits=%d%d, reserved=%d");
  strncat(local_1b8,local_138 + 0x80,0x7f);
  if (resultstr == (char *)0x0) {
    AnalyzerResults::AddResultString
              ((char *)this,local_138,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,local_1b8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  else {
    strcpy(resultstr,local_1b8);
  }
  return;
}

Assistant:

void SMPTEAnalyzerResults::fillSMPTE(Frame frame, char * resultstr) 
{
	//                    frame     seconds   minutes   hours  
	const int max[8] = {   9,   4,   9,   5,   9,   5,   9,   2 };
	const int msk[8] = { 0xF, 0x3, 0xF, 0x7, 0xF, 0x7, 0xF, 0x3 };

	char str[128];
	char str2[128];
	int i;

	// We avoid direct bit operations on mData - as we're not
	// sure of the byte order of the varios platforms.
	//
	U8 *m = (U8*)&(frame.mData1);

	bzero(str, sizeof(str));
	for(i = 7; i >= 0; i--) {
		U8 c = m[i] & msk[i];
		if (c <= max[i])
			c += '0';
		else
			c = '?';
		str[ strlen(str) ] = c;

		if (i && (i %2) == 0) {
			str[ strlen(str) ] = (i == 2) ? '.' : ':';
		};
	};
	if (!resultstr) {
		AddResultString("T");
		AddResultString("TS");
		AddResultString( str + 8); // Just the .framecount
		AddResultString( str + 6); // Seconds, frames
		AddResultString( str + 3); // min/seconds/frames
		AddResultString( str );	   // whole HMS.frame
	};
	
	// From here we work on an abridge string and a fully
	// elaborated string in parallel.
	//	
	strcpy(str2,str);

	if (BIT(m,DROPBIT)) {
		strncat(str,"d", sizeof(str)-1);
		strncat(str2," drop", sizeof(str)-1);
	} else {
		strncat(str2," no-drop", sizeof(str)-1);
	};

	if (BIT(m,COLBIT)) {
		strncat(str,"c", sizeof(str)-1);
		strncat(str2," colour", sizeof(str)-1);
	} else {
		strncat(str2," no-colour", sizeof(str)-1);
	};
	
	// stick to machine byte order indepennt method.
	//
	// U64 p = frame.mData1; p ^= p >> 32; p ^= p >> 8; p ^= p >> 4; p ^= p >> 2; p ^= p >> 1; 
	//
	U32 p = 1; // for bte 8 & 9
	for(U32 i = 0; i < 8; i++) p ^= m[i];
	p ^= p >> 4; p ^= p >> 2; p ^= p >> 1; 

	// Should be an even number of bits; if we include
	// the parity bit in the list./
	//
	if ((p & 1) == 0) {
		strncat(str,"p", sizeof(str)-1);
		strncat(str2," parity-ok", sizeof(str2)-1);
	} else {
		strncat(str," P", sizeof(str)-1);
		strncat(str2," Parity-FAIL!", sizeof(str2)-1);
	};
	char buff[128];
	snprintf(buff,sizeof(buff)," User=%X-%X-%X-%X-%X-%X-%X-%X, groupBits=%d%d, reserved=%d",
			       //  0 ..  3  -- L frame
		(m[0]>>4)&0xF, //  4 ..  7     user 1
			       //  8 ..  9  -- H frame
			       //  10          drop frame
			       //  11          colour
		(m[1]>>4)&0xF, // 12 .. 15     user 2
			       // 16 .. 19     L sec
		(m[2]>>4)&0xF, // 20 .. 23     user 3
			       // 24 .. 26     H sec
                               //              parity bit
		(m[3]>>4)&0xF, // 28 .. 31     user 4
			       // 32 .. 35     L min
		(m[4]>>4)&0xF, // 36 .. 39     user 5
			       // 40 .. 42     H min
                               // 43           group bit 
		(m[5]>>4)&0xF, // 44 .. 47     user 6
			       // 47 .. 51     L hour
		(m[6]>>4)&0xF, // 52 .. 55     user 7
			       // 56 .. 57     H hour
                               // 58           reserved
                               // 59           group bit
		(m[7]>>4)&0xF, // 60 .. 63     user 8
			       // 64 .. 79     code words (16 bits)
		BIT(m,GR1BIT), // 43 - group bit
		BIT(m,GR2BIT), // 59 - group bit
		BIT(m,RESBIT)  // 58 - reserved
	);
	strncat(str2, buff, sizeof(str2)-1);

	if (!resultstr) {
		AddResultString( str );
		AddResultString( str2 );
	} else {
		strcpy(resultstr, str2);
	};
}